

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

htmlDocPtr htmlNewDocNoDtD(xmlChar *URI,xmlChar *ExternalID)

{
  xmlDocPtr doc;
  
  doc = (xmlDocPtr)(*xmlMalloc)(0xb0);
  if (doc == (xmlDocPtr)0x0) {
    doc = (xmlDocPtr)0x0;
    htmlErrMemory((xmlParserCtxtPtr)0x0,"HTML document creation failed\n");
  }
  else {
    memset(doc,0,0xb0);
    doc->type = XML_HTML_DOCUMENT_NODE;
    doc->version = (xmlChar *)0x0;
    doc->encoding = (xmlChar *)0x0;
    doc->intSubset = (_xmlDtd *)0x0;
    doc->doc = doc;
    doc->name = (char *)0x0;
    doc->children = (_xmlNode *)0x0;
    doc->extSubset = (_xmlDtd *)0x0;
    doc->oldNs = (_xmlNs *)0x0;
    doc->compression = 0;
    doc->standalone = 1;
    doc->_private = (void *)0x0;
    doc->ids = (void *)0x0;
    doc->refs = (void *)0x0;
    doc->charset = 1;
    doc->properties = 0xa0;
    if (URI != (xmlChar *)0x0 || ExternalID != (xmlChar *)0x0) {
      xmlCreateIntSubset(doc,"html",ExternalID,URI);
    }
  }
  return doc;
}

Assistant:

htmlDocPtr
htmlNewDocNoDtD(const xmlChar *URI, const xmlChar *ExternalID) {
    xmlDocPtr cur;

    /*
     * Allocate a new document and fill the fields.
     */
    cur = (xmlDocPtr) xmlMalloc(sizeof(xmlDoc));
    if (cur == NULL) {
	htmlErrMemory(NULL, "HTML document creation failed\n");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlDoc));

    cur->type = XML_HTML_DOCUMENT_NODE;
    cur->version = NULL;
    cur->intSubset = NULL;
    cur->doc = cur;
    cur->name = NULL;
    cur->children = NULL;
    cur->extSubset = NULL;
    cur->oldNs = NULL;
    cur->encoding = NULL;
    cur->standalone = 1;
    cur->compression = 0;
    cur->ids = NULL;
    cur->refs = NULL;
    cur->_private = NULL;
    cur->charset = XML_CHAR_ENCODING_UTF8;
    cur->properties = XML_DOC_HTML | XML_DOC_USERBUILT;
    if ((ExternalID != NULL) ||
	(URI != NULL))
	xmlCreateIntSubset(cur, BAD_CAST "html", ExternalID, URI);
    return(cur);
}